

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O1

void __thiscall
Diligent::DynamicDescriptorSetAllocator::ReleasePools
          (DynamicDescriptorSetAllocator *this,Uint64 QueueMask)

{
  DescriptorPoolWrapper *pDVar1;
  pointer pVVar2;
  pointer pVVar3;
  ulong uVar4;
  pointer this_00;
  DescriptorPoolWrapper *Pool;
  DescriptorPoolWrapper *Pool_00;
  
  pDVar1 = (this->m_AllocatedPools).
           super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (Pool_00 = (this->m_AllocatedPools).
                 super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; Pool_00 != pDVar1; Pool_00 = Pool_00 + 1
      ) {
    DescriptorPoolManager::DisposePool(this->m_GlobalPoolMgr,Pool_00,QueueMask);
  }
  pVVar2 = (this->m_AllocatedPools).
           super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this->m_AllocatedPools).
           super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = ((long)pVVar3 - (long)pVVar2 >> 3) * -0x5555555555555555;
  if (uVar4 < this->m_PeakPoolCount) {
    uVar4 = this->m_PeakPoolCount;
  }
  this->m_PeakPoolCount = uVar4;
  this_00 = pVVar2;
  if (pVVar3 != pVVar2) {
    do {
      VulkanUtilities::
      VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
      ~VulkanObjectWrapper(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pVVar3);
    (this->m_AllocatedPools).
    super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  return;
}

Assistant:

void DynamicDescriptorSetAllocator::ReleasePools(Uint64 QueueMask)
{
    for (VulkanUtilities::DescriptorPoolWrapper& Pool : m_AllocatedPools)
    {
        m_GlobalPoolMgr.DisposePool(std::move(Pool), QueueMask);
    }
    m_PeakPoolCount = std::max(m_PeakPoolCount, m_AllocatedPools.size());
    m_AllocatedPools.clear();
}